

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::SingleArena_CopyConstructSSO_Test::TestBody
          (SingleArena_CopyConstructSSO_Test *this)

{
  char *message;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  AssertHelper local_58;
  WithParamInterface<bool> local_50;
  ArenaStringPtr field;
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  string empty;
  
  empty._M_dataplus._M_p = (pointer)&empty.field_2;
  empty._M_string_length = 0;
  empty.field_2._M_local_buf[0] = '\0';
  SingleArena::GetArena((SingleArena *)&arena);
  internal::TaggedStringPtr::SetDefault(&field.tagged_ptr_,&empty);
  internal::ArenaStringPtr::Set(&field,"Hello world",(Arena *)0x0);
  dst.tagged_ptr_ =
       internal::TaggedStringPtr::Copy
                 (&field.tagged_ptr_,
                  (Arena *)arena._M_t.
                           super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
                           .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)&gtest_ar,"dst.Get()","\"Hello world\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)dst.tagged_ptr_.ptr_ & 0xfffffffffffffffc),(char (*) [12])"Hello world");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xbd,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._vptr_WithParamInterface != (_func_int **)0x0) {
      (**(code **)(*local_50._vptr_WithParamInterface + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  if ((__uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>)
      arena._M_t.
      super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>.
      _M_t.
      super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
      .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>)0x0)
  {
    internal::ArenaStringPtr::Destroy(&dst);
  }
  internal::ArenaStringPtr::Destroy(&field);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr(&arena);
  std::__cxx11::string::~string((string *)&empty);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructSSO) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("Hello world", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "Hello world");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}